

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O2

string * pbrt::detail::copyToFormatString(string *__return_storage_ptr__,char **fmt_ptr,string *s)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  
  pbVar2 = (byte *)*fmt_ptr;
  do {
    if (*pbVar2 == 0x25) {
      if (pbVar2[1] != 0x25) {
LAB_00328216:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        do {
          bVar1 = *pbVar2;
          if (bVar1 == 0) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          uVar3 = bVar1 - 0x41;
          pbVar2 = (byte *)(*fmt_ptr + 1);
          *fmt_ptr = (char *)pbVar2;
        } while ((0x37 < uVar3) || ((0x94c17d00040075U >> ((ulong)uVar3 & 0x3f) & 1) == 0));
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)s);
      lVar4 = 2;
    }
    else {
      lVar4 = 1;
      if (*pbVar2 == 0) goto LAB_00328216;
    }
    std::__cxx11::string::push_back((char)s);
    pbVar2 = (byte *)(*fmt_ptr + lVar4);
    *fmt_ptr = (char *)pbVar2;
  } while( true );
}

Assistant:

std::string copyToFormatString(const char **fmt_ptr, std::string *s) {
    const char *&fmt = *fmt_ptr;
    while (*fmt) {
        if (*fmt != '%') {
            *s += *fmt;
            ++fmt;
        } else if (fmt[1] == '%') {
            // "%%"; let it pass through
            *s += '%';
            *s += '%';
            fmt += 2;
        } else
            // fmt is at the start of a formatting directive.
            break;
    }

    std::string nextFmt;
    while (*fmt) {
        char c = *fmt;
        nextFmt += c;
        ++fmt;
        // Is it a conversion specifier?
        if (c == 'd' || c == 'i' || c == 'o' || c == 'u' || c == 'x' || c == 'e' ||
            c == 'E' || c == 'f' || c == 'F' || c == 'g' || c == 'G' || c == 'a' ||
            c == 'A' || c == 'c' || c == 'C' || c == 's' || c == 'S' || c == 'p')
            break;
    }

    return nextFmt;
}